

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O1

aiBool aiIsExtensionSupported(char *szExtension)

{
  bool bVar1;
  size_t sVar2;
  Importer tmp;
  Importer IStack_38;
  long *local_30 [2];
  long local_20 [2];
  
  if (szExtension != (char *)0x0) {
    Assimp::Importer::Importer(&IStack_38);
    local_30[0] = local_20;
    sVar2 = strlen(szExtension);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_30,szExtension,szExtension + sVar2);
    bVar1 = Assimp::Importer::IsExtensionSupported(&IStack_38,(char *)local_30[0]);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
    Assimp::Importer::~Importer(&IStack_38);
    return (uint)bVar1;
  }
  __assert_fail("__null != szExtension",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x1dc,"aiBool aiIsExtensionSupported(const char *)");
}

Assistant:

aiBool aiIsExtensionSupported(const char* szExtension)
{
    ai_assert(NULL != szExtension);
    aiBool candoit=AI_FALSE;
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // FIXME: no need to create a temporary Importer instance just for that ..
    Assimp::Importer tmp;
    candoit = tmp.IsExtensionSupported(std::string(szExtension)) ? AI_TRUE : AI_FALSE;

    ASSIMP_END_EXCEPTION_REGION(aiBool);
    return candoit;
}